

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testDeserializeAndValidateHeartbeat(int count)

{
  long lVar1;
  pointer pDataDictionary;
  long lVar2;
  int local_1a4;
  int i;
  long start;
  undefined1 local_188 [8];
  string string;
  Heartbeat message;
  int count_local;
  
  FIX42::Heartbeat::Heartbeat((Heartbeat *)(&string.field_2._M_allocated_capacity + 1));
  FIX::Message::toString_abi_cxx11_
            ((int)local_188,(int)(Heartbeat *)(&string.field_2._M_allocated_capacity + 1),8);
  lVar1 = GetTickCount();
  for (local_1a4 = 0; local_1a4 <= count + -1; local_1a4 = local_1a4 + 1) {
    pDataDictionary =
         std::unique_ptr<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>::get
                   (&s_dataDictionary);
    FIX::Message::setString
              ((Message *)(string.field_2._M_local_buf + 8),(string *)local_188,true,pDataDictionary
              );
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)local_188);
  FIX42::Heartbeat::~Heartbeat((Heartbeat *)((long)&string.field_2 + 8));
  return lVar2 - lVar1;
}

Assistant:

long testDeserializeAndValidateHeartbeat(int count) {
  FIX42::Heartbeat message;
  std::string string = message.toString();
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    message.setString(string, VALIDATE, s_dataDictionary.get());
  }
  return GetTickCount() - start;
}